

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jason.c
# Opt level: O0

void PushId(void)

{
  boolean bVar1;
  
  bVar1 = isvalidtype(oldtabindex);
  if (bVar1 == NO) {
    printlexeme(oldtabindex);
    error(" is an invalid type",linenum);
  }
  actionpush(oldtabindex);
  return;
}

Assistant:

void	PushId(void)
{
    if (!isvalidtype(oldtabindex))	{
        printlexeme(oldtabindex);
        error(" is an invalid type", linenum);
    }
    actionpush(oldtabindex);
}